

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FileEnumerator.cpp
# Opt level: O0

String * __thiscall axl::io::FileEnumerator::getNextFileName(FileEnumerator *this)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RSI;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  int result;
  dirent *dirEntryPtr;
  dirent dirEntry;
  String *fileName;
  C *in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  dirent *local_138;
  dirent local_130;
  undefined1 local_11;
  
  this_00 = in_RDI;
  bVar1 = sl::
          Handle<__dirstream_*,_axl::io::CloseFileEnumeratorHandle,_axl::sl::Zero<__dirstream_*>_>::
          isOpen((Handle<__dirstream_*,_axl::io::CloseFileEnumeratorHandle,_axl::sl::Zero<__dirstream_*>_>
                  *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  if (bVar1) {
    local_11 = 0;
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase(this_00,in_RDI);
    iVar2 = readdir_r((DIR *)*in_RSI,&local_130,&local_138);
    if ((iVar2 == 0) && (local_138 != (dirent *)0x0)) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                 (ulong)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    else {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                 CONCAT44(iVar2,in_stack_fffffffffffffe90));
    }
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16eee4);
  }
  return this_00;
}

Assistant:

sl::String
FileEnumerator::getNextFileName() {
	if (!isOpen())
		return sl::String();

	sl::String fileName = m_nextFileName;

	dirent dirEntry;
	dirent* dirEntryPtr;
	int result = readdir_r(m_h, &dirEntry, &dirEntryPtr);

	if (result == 0 && dirEntryPtr)
		m_nextFileName = dirEntryPtr->d_name;
	else
		m_nextFileName.clear();

	return fileName;
}